

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  RABlock *block;
  Error EVar1;
  RABlock **ppRVar2;
  RASharedAssignment *pRVar3;
  
  EVar1 = 3;
  if ((targets->super_ZoneVectorBase)._size != 0) {
    (this->_cc->super_BaseBuilder)._cursor = (node->super_BaseNode).field_0.field_0._prev;
    ppRVar2 = ZoneVector<asmjit::RABlock_*>::operator[](targets,0);
    block = *ppRVar2;
    if ((ulong)block->_sharedAssignmentId != 0xffffffff) {
      pRVar3 = ZoneVector<asmjit::RASharedAssignment>::operator[]
                         (&this->_pass->_sharedAssignments,(ulong)block->_sharedAssignmentId);
      EVar1 = allocInst(this,node);
      if (((EVar1 == 0) &&
          (((*(PhysToWorkMap **)(pRVar3 + 0x18) == (PhysToWorkMap *)0x0 ||
            (EVar1 = switchToAssignment(this,*(PhysToWorkMap **)(pRVar3 + 0x18),
                                        *(WorkToPhysMap **)(pRVar3 + 0x20),
                                        (ZoneBitVector *)(pRVar3 + 8),true,false), EVar1 == 0)) &&
           (EVar1 = spillRegsBeforeEntry(this,block), EVar1 == 0)))) &&
         ((*(long *)(pRVar3 + 0x18) != 0 ||
          (EVar1 = BaseRAPass::setBlockEntryAssignment
                             (this->_pass,block,this->_block,&this->_curAssignment), EVar1 == 0))))
      {
        EVar1 = 0;
      }
    }
  }
  return EVar1;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.workToPhysMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}